

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O0

uint8_t * quicly_encode_ack_frame
                    (uint8_t *dst,uint8_t *dst_end,quicly_ranges_t *ranges,uint64_t ack_delay)

{
  long lVar1;
  uint8_t *puVar2;
  long *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  uint64_t _end_1;
  uint64_t _start_1;
  uint64_t _end;
  uint64_t _start;
  size_t range_index;
  uint64_t in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  long local_30;
  uint8_t *local_10;
  
  lVar1 = in_RDX[1];
  if (in_RDX[1] == 0) {
    __assert_fail("ranges->num_ranges != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                  ,0x2f,
                  "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
                 );
  }
  *in_RDI = 2;
  ptls_encode_quicint(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  puVar2 = ptls_encode_quicint(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_10 = puVar2 + 1;
  *puVar2 = (char)in_RDX[1] + 0xff;
  local_30 = lVar1 + -1;
  while( true ) {
    if (*(ulong *)(*in_RDX + local_30 * 0x10 + 8) <= *(ulong *)(*in_RDX + local_30 * 0x10)) {
      __assert_fail("_start < _end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                    ,0x39,
                    "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
                   );
    }
    if (in_RSI - (long)local_10 < 8) {
      return (uint8_t *)0x0;
    }
    puVar2 = ptls_encode_quicint(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (local_30 == 0) {
      return puVar2;
    }
    in_stack_ffffffffffffffb0 = *(uint8_t **)(*in_RDX + local_30 * 0x10);
    if (in_stack_ffffffffffffffb0 <= *(uint8_t **)(*in_RDX + (local_30 + -1) * 0x10 + 8)) break;
    if (in_RSI - (long)puVar2 < 8) {
      return (uint8_t *)0x0;
    }
    local_10 = ptls_encode_quicint(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_30 = local_30 + -1;
  }
  __assert_fail("_start < _end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                ,0x3c,
                "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
               );
}

Assistant:

uint8_t *quicly_encode_ack_frame(uint8_t *dst, uint8_t *dst_end, quicly_ranges_t *ranges, uint64_t ack_delay)
{
#define WRITE_BLOCK(start, end)                                                                                                    \
    do {                                                                                                                           \
        uint64_t _start = (start), _end = (end);                                                                                   \
        assert(_start < _end);                                                                                                     \
        if (dst_end - dst < 8)                                                                                                     \
            return NULL;                                                                                                           \
        dst = quicly_encodev(dst, _end - _start - 1);                                                                              \
    } while (0)

    size_t range_index = ranges->num_ranges - 1;

    assert(ranges->num_ranges != 0);

    /* number of bytes being emitted without space check are 1 + 8 + 8 + 1 bytes (as defined in QUICLY_ACK_FRAME_CAPACITY) */
    *dst++ = QUICLY_FRAME_TYPE_ACK;
    dst = quicly_encodev(dst, ranges->ranges[range_index].end - 1); /* largest acknowledged */
    dst = quicly_encodev(dst, ack_delay);                           /* ack delay */
    PTLS_BUILD_ASSERT(QUICLY_MAX_ACK_BLOCKS - 1 <= 63);
    *dst++ = (uint8_t)(ranges->num_ranges - 1); /* ack blocks */

    while (1) {
        WRITE_BLOCK(ranges->ranges[range_index].start, ranges->ranges[range_index].end); /* ACK block count */
        if (range_index-- == 0)
            break;
        WRITE_BLOCK(ranges->ranges[range_index].end, ranges->ranges[range_index + 1].start);
    }

    return dst;

#undef WRITE_BLOCK
}